

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O3

void mocker::anon_unknown_0::genCall
               (Section *text,FuncSelectionContext *ctx,shared_ptr<mocker::ir::Call> *p)

{
  element_type *peVar1;
  pointer psVar2;
  int iVar3;
  element_type *peVar4;
  shared_ptr<mocker::nasm::Register> *psVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char *__end;
  size_t i;
  ulong uVar9;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  shared_ptr<mocker::nasm::Addr> retVal;
  shared_ptr<mocker::nasm::Register> tmp;
  shared_ptr<mocker::nasm::Register> rspCopy;
  FuncSelectionContext *local_b8;
  undefined1 local_b0 [16];
  element_type local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  element_type *local_70;
  __node_base local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_b8 = ctx;
  if ((anonymous_namespace)::
      genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
      ::ParamRegs == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                                 ::ParamRegs);
    if (iVar3 != 0) {
      psVar5 = nasm::rdi();
      local_b0._0_8_ =
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b0._8_8_ =
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count + 1;
        }
      }
      psVar5 = nasm::rsi();
      local_a0.super_Addr._vptr_Addr =
           (_func_int **)
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a0.identifier._M_dataplus._M_p =
           (pointer)(psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.identifier._M_dataplus._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.identifier._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a0.identifier._M_dataplus._M_p)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.identifier._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a0.identifier._M_dataplus._M_p)->_M_use_count + 1;
        }
      }
      psVar5 = nasm::rdx();
      local_a0.identifier._M_string_length =
           (size_type)
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a0.identifier.field_2._M_allocated_capacity =
           (size_type)
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a0.identifier.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a0.identifier.field_2._M_allocated_capacity)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a0.identifier.field_2._M_allocated_capacity)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a0.identifier.field_2._M_allocated_capacity)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a0.identifier.field_2._M_allocated_capacity)->_M_use_count + 1;
        }
      }
      psVar5 = nasm::rcx();
      local_a0.identifier.field_2._8_8_ =
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_78 = (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_78->_M_use_count = local_78->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_78->_M_use_count = local_78->_M_use_count + 1;
        }
      }
      psVar5 = nasm::r8();
      local_70 = (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_68._M_nxt =
           (_Hash_node_base *)
           (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_nxt !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_nxt)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_nxt)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_nxt)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_nxt)->_M_use_count + 1;
        }
      }
      psVar5 = nasm::r9();
      local_60 = (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_58 = (psVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      __l._M_len = 6;
      __l._M_array = (iterator)local_b0;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(&genCall::ParamRegs,__l,(allocator_type *)&stack0xffffffffffffffc0);
      lVar8 = 0x60;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + lVar8) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + lVar8));
        }
        lVar8 = lVar8 + -0x10;
      } while (lVar8 != 0);
      __cxa_atexit(std::
                   vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ::~vector,&genCall::ParamRegs,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                           ::ParamRegs);
    }
  }
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  FuncSelectionContext::newVirtualReg
            ((FuncSelectionContext *)&stack0xffffffffffffffc0,(string *)local_b8);
  if ((element_type *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)((long)local_a0.super_Addr._vptr_Addr + 1));
  }
  if (nasm::rsp()::res == '\0') {
    iVar3 = __cxa_guard_acquire(&nasm::rsp()::res);
    if (iVar3 != 0) {
      nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rsp::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rsp::res,(allocator<mocker::nasm::Register> *)local_b0,
                 (char (*) [4])"rsp");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
      __cxa_guard_release(&nasm::rsp()::res);
    }
  }
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            (text,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0,&nasm::rsp::res);
  lVar8 = 0;
  uVar9 = 0;
  do {
    psVar2 = genCall::ParamRegs.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar4 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar7 = (long)(peVar4->args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar4->args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)uVar7 >> 4) <= uVar9) goto LAB_0011aa13;
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b0,(shared_ptr<mocker::ir::Addr> *)local_b8);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Register> *)
                    ((long)&(psVar2->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar8),(shared_ptr<mocker::nasm::Addr> *)local_b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x10;
  } while (uVar9 != 6);
  peVar4 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar7 = (long)(peVar4->args).
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar4->args).
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0011aa13:
  uVar6 = (int)(uVar7 >> 4) - 1;
  if (5 < (int)uVar6) {
    lVar8 = (ulong)uVar6 + 1;
    do {
      local_b0._0_8_ = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"","");
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_50,(string *)local_b8);
      if ((element_type *)local_b0._0_8_ != &local_a0) {
        operator_delete((void *)local_b0._0_8_,(ulong)((long)local_a0.super_Addr._vptr_Addr + 1));
      }
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_b0,(shared_ptr<mocker::ir::Addr> *)local_b8);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,(shared_ptr<mocker::nasm::Register> *)local_50,
                 (shared_ptr<mocker::nasm::Addr> *)local_b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
      }
      nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
                (text,(shared_ptr<mocker::nasm::Register> *)local_50);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      }
      lVar8 = lVar8 + -1;
    } while (6 < lVar8);
    peVar4 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  renameIdentifier((string *)local_b0,(anon_unknown_0 *)(peVar4->funcName)._M_dataplus._M_p,
                   (string *)(peVar4->funcName)._M_string_length);
  nasm::Section::emplaceInst<mocker::nasm::Call,std::__cxx11::string>
            (text,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if ((element_type *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)((long)local_a0.super_Addr._vptr_Addr + 1));
  }
  peVar4 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar1 = (peVar4->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_50._8_8_ =
         (peVar4->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
      }
    }
    local_50._0_8_ = peVar1;
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b0,(shared_ptr<mocker::ir::Addr> *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    if (nasm::rax()::res == '\0') {
      iVar3 = __cxa_guard_acquire(&nasm::rax()::res);
      if (iVar3 != 0) {
        nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rax::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rax::res,
                   (allocator<mocker::nasm::Register> *)local_50,(char (*) [4])"rax");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rax::res,&__dso_handle);
        __cxa_guard_release(&nasm::rax()::res);
      }
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_b0,&nasm::rax::res);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    peVar4 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (0x60 < (ulong)((long)(peVar4->args).
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar4->args).
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    if (nasm::rsp()::res == '\0') {
      iVar3 = __cxa_guard_acquire(&nasm::rsp()::res);
      if (iVar3 != 0) {
        nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rsp::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rsp::res,
                   (allocator<mocker::nasm::Register> *)local_b0,(char (*) [4])"rsp");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
        __cxa_guard_release(&nasm::rsp()::res);
      }
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,&nasm::rsp::res,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return;
}

Assistant:

void genCall(nasm::Section &text, FuncSelectionContext &ctx,
             const std::shared_ptr<ir::Call> &p) {
  static const std::vector<std::shared_ptr<nasm::Register>> ParamRegs = {
      nasm::rdi(), nasm::rsi(), nasm::rdx(),
      nasm::rcx(), nasm::r8(),  nasm::r9()};
  auto rspCopy = ctx.newVirtualReg();
  text.emplaceInst<nasm::Mov>(rspCopy, nasm::rsp());

  for (std::size_t i = 0; i < 6 && i < p->getArgs().size(); ++i) {
    text.emplaceInst<nasm::Mov>(ParamRegs[i], ctx.getIrAddr(p->getArgs()[i]));
  }
  for (int i = p->getArgs().size() - 1; i >= 6; --i) {
    auto tmp = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(tmp, ctx.getIrAddr(p->getArgs()[i]));
    text.emplaceInst<nasm::Push>(tmp);
  }

  text.emplaceInst<nasm::Call>(renameIdentifier(p->getFuncName()));
  if (p->getDest()) {
    auto retVal = ctx.getIrAddr(p->getDest());
    text.emplaceInst<nasm::Mov>(retVal, nasm::rax());
  }

  if (p->getArgs().size() > 6) {
    text.emplaceInst<nasm::Mov>(nasm::rsp(), rspCopy);
  }
}